

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator<=(result *__return_storage_ptr__,
          expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>
          *this,char (*rhs) [6])

{
  lest *this_00;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  bool bVar1;
  size_t sVar2;
  char (*in_R8) [6];
  type rhs_00;
  allocator local_d9;
  char *local_d8;
  size_type local_d0;
  char local_c8 [8];
  undefined8 uStack_c0;
  string local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  char local_88 [8];
  undefined8 uStack_80;
  char *local_78;
  size_type local_70;
  char local_68 [8];
  undefined8 uStack_60;
  undefined1 local_58 [40];
  
  lhs = **(basic_string_view<char,_std::char_traits<char>_> **)this;
  sVar2 = strlen(*rhs);
  rhs_00.size_ = sVar2;
  rhs_00.data_ = *rhs;
  bVar1 = nonstd::sv_lite::operator<=(lhs,rhs_00);
  this_00 = *(lest **)this;
  std::__cxx11::string::string((string *)&local_d8,"<=",&local_d9);
  local_98.data_ = local_88;
  if (local_d8 == local_c8) {
    uStack_80 = uStack_c0;
  }
  else {
    local_98.data_ = local_d8;
  }
  local_98.size_ = local_d0;
  local_d0 = 0;
  local_c8[0] = '\0';
  local_d8 = local_c8;
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,char[6]>
            (&local_b8,this_00,&local_98,(string *)rhs,in_R8);
  local_70 = local_b8._M_string_length;
  local_78 = local_68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    uStack_60 = local_b8.field_2._8_8_;
  }
  else {
    local_78 = local_b8._M_dataplus._M_p;
  }
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_58[0] = bVar1;
  std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_78);
  result::result(__return_storage_ptr__,(result *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

result operator>=( R const & rhs ) { return result( lhs >= rhs, to_string( lhs, ">=", rhs ) ); }